

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

bool __thiscall dg::llvmdg::DGCallGraphImpl::calls(DGCallGraphImpl *this,Function *F,Function *what)

{
  bool bVar1;
  FuncNode *this_00;
  FuncNode *pFVar2;
  long in_RDI;
  FuncNode *fn2;
  FuncNode *fn1;
  iterator it2;
  iterator it;
  map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
  *in_stack_ffffffffffffff98;
  FuncNode *x;
  FuncNode *this_01;
  PSNode **in_stack_ffffffffffffffb0;
  GenericCallGraph<dg::pta::PSNode_*> *in_stack_ffffffffffffffb8;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  _Self local_28 [4];
  bool local_1;
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x1a6f6b);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    local_1 = false;
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
         ::find(in_stack_ffffffffffffff98,(key_type *)0x1a6fb5);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::Function_*,_dg::pta::PSNode_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_38,&local_40);
    if (bVar1) {
      local_1 = false;
    }
    else {
      x = *(FuncNode **)(in_RDI + 8);
      std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_> *)
                 0x1a7003);
      this_00 = GenericCallGraph<dg::pta::PSNode_*>::get
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      this_01 = *(FuncNode **)(in_RDI + 8);
      std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::pta::PSNode_*>_> *)
                 0x1a7033);
      pFVar2 = GenericCallGraph<dg::pta::PSNode_*>::get
                         ((GenericCallGraph<dg::pta::PSNode_*> *)this_00,in_stack_ffffffffffffffb0);
      if ((this_00 == (FuncNode *)0x0) || (pFVar2 == (FuncNode *)0x0)) {
        local_1 = false;
      }
      else {
        local_1 = GenericCallGraph<dg::pta::PSNode_*>::FuncNode::calls(this_01,x);
      }
    }
  }
  return local_1;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        auto it = _mapping.find(F);
        if (it == _mapping.end())
            return false;
        auto it2 = _mapping.find(what);
        if (it2 == _mapping.end())
            return false;
        const auto *fn1 = _cg.get(it->second);
        const auto *fn2 = _cg.get(it2->second);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }